

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizard::next(QWizard *this)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  QWizardPrivate *this_00;
  ulong uVar4;
  long *in_RDI;
  long in_FS_OFFSET;
  QWizardPrivate *d;
  int next;
  int line;
  long *key;
  QMessageLogger *in_stack_ffffffffffffffb0;
  char local_30 [24];
  Direction in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key = in_RDI;
  this_00 = d_func((QWizard *)0x7bc3e9);
  if (((this_00->current != -1) && (uVar4 = (**(code **)(*in_RDI + 0x1c8))(), (uVar4 & 1) != 0)) &&
     (uVar3 = (**(code **)(*in_RDI + 0x1d0))(), uVar3 != 0xffffffff)) {
    bVar2 = QListSpecialMethodsBase<int>::contains<int>
                      ((QListSpecialMethodsBase<int> *)this_00,(int *)in_RDI);
    line = (int)((ulong)this_00 >> 0x20);
    if (bVar2) {
      QMessageLogger::QMessageLogger(in_stack_ffffffffffffffb0,(char *)key,line,(char *)in_RDI);
      QMessageLogger::warning(local_30,"QWizard::next: Page %d already met",(ulong)uVar3);
    }
    else {
      bVar2 = QMap<int,_QWizardPage_*>::contains
                        ((QMap<int,_QWizardPage_*> *)in_stack_ffffffffffffffb0,(int *)key);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        QWizardPrivate::switchToPage
                  ((QWizardPrivate *)CONCAT44(uVar3,in_stack_fffffffffffffff0),
                   in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
      }
      else {
        QMessageLogger::QMessageLogger(in_stack_ffffffffffffffb0,(char *)key,line,(char *)in_RDI);
        QMessageLogger::warning
                  (&stack0xffffffffffffffb0,"QWizard::next: No such page %d",(ulong)uVar3);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizard::next()
{
    Q_D(QWizard);

    if (d->current == -1)
        return;

    if (validateCurrentPage()) {
        int next = nextId();
        if (next != -1) {
            if (Q_UNLIKELY(d->history.contains(next))) {
                qWarning("QWizard::next: Page %d already met", next);
                return;
            }
            if (Q_UNLIKELY(!d->pageMap.contains(next))) {
                qWarning("QWizard::next: No such page %d", next);
                return;
            }
            d->switchToPage(next, QWizardPrivate::Forward);
        }
    }
}